

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

void build_staircase_rooms(chunk *c,char *label)

{
  undefined1 (*pauVar1) [16];
  undefined8 *puVar2;
  wchar_t wVar3;
  cave_profile *pcVar4;
  room_profile *prVar5;
  undefined8 uVar6;
  connector *pcVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  room_profile profile_00;
  undefined1 auVar12 [16];
  _Bool _Var13;
  int iVar14;
  ulong uVar15;
  char *title;
  ulong uVar16;
  dun_data *pdVar17;
  connector **ppcVar18;
  room_profile profile;
  
  pdVar17 = dun;
  pcVar4 = dun->profile;
  wVar3 = pcVar4->n_room_profiles;
  uVar15 = (ulong)(uint)wVar3;
  if (wVar3 < L'\x01') {
    uVar15 = 0;
  }
  uVar16 = 0;
  do {
    if (uVar15 * 0x38 + 0x38 == uVar16 + 0x38) {
      __assert_fail("i < num_rooms",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-cave.c"
                    ,0x39e,"void build_staircase_rooms(struct chunk *, const char *)");
    }
    prVar5 = pcVar4->room_profiles;
    pauVar1 = (undefined1 (*) [16])((long)&prVar5->next + uVar16);
    auVar12 = *pauVar1;
    puVar2 = (undefined8 *)((long)&prVar5->builder + uVar16);
    uVar8 = *puVar2;
    uVar9 = puVar2[1];
    puVar2 = (undefined8 *)((long)&prVar5->width + uVar16);
    uVar10 = *puVar2;
    uVar11 = puVar2[1];
    uVar6 = *(undefined8 *)((long)&prVar5->cutoff + uVar16);
    iVar14 = strcmp(*(char **)(*pauVar1 + 8),"staircase room");
    uVar16 = uVar16 + 0x38;
  } while (iVar14 != 0);
  ppcVar18 = &pdVar17->join;
  while (pcVar7 = *ppcVar18, pcVar7 != (connector *)0x0) {
    pdVar17->curr_join = pcVar7;
    profile_00.builder = (room_builder)uVar8;
    profile_00._0_16_ = auVar12;
    profile_00._24_8_ = uVar9;
    profile_00._32_8_ = uVar10;
    profile_00._40_8_ = uVar11;
    profile_00._48_8_ = uVar6;
    _Var13 = room_build(c,((pcVar7->grid).y + -1) / pdVar17->block_hgt,
                        ((pcVar7->grid).x + -1) / pdVar17->block_wid,profile_00,true);
    if (!_Var13) {
      title = format("%s:  Failed to Build Staircase Room at Row=%d Column=%d in a Cave with %d Rows and %d Columns"
                     ,label,(ulong)(uint)(pcVar7->grid).y,(ulong)(uint)(pcVar7->grid).x,
                     (ulong)(uint)c->height,(ulong)(uint)c->width);
      dump_level_simple((char *)0x0,title,(chunk_conflict *)c);
      quit("Failed to place stairs");
    }
    pdVar17 = dun;
    dun->nstair_room = dun->nstair_room + L'\x01';
    ppcVar18 = &pcVar7->next;
  }
  return;
}

Assistant:

static void build_staircase_rooms(struct chunk *c, const char *label)
{
	int num_rooms = dun->profile->n_room_profiles;
	struct room_profile profile;
	struct connector *join;
	int i;

	for (i = 0; i < num_rooms; i++) {
		profile = dun->profile->room_profiles[i];
		if (streq(profile.name, "staircase room")) {
			break;
		}
	}
	assert(i < num_rooms);
	for (join = dun->join; join; join = join->next) {
		dun->curr_join = join;
		if (!room_build(c, (join->grid.y - 1) / dun->block_hgt,
				(join->grid.x - 1) / dun->block_wid,
				profile, true)) {
			dump_level_simple(NULL, format("%s:  Failed to Build "
				"Staircase Room at Row=%d Column=%d in a "
				"Cave with %d Rows and %d Columns", label,
				join->grid.y, join->grid.x, c->height,
				c->width), c);
			quit("Failed to place stairs");
		}
		++dun->nstair_room;
	}
}